

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

Error __thiscall asmjit::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  size_t *psVar1;
  size_t __n;
  Gap *pGVar2;
  Zone *pZVar3;
  Error EVar4;
  uint uVar5;
  long lVar6;
  void *pvVar7;
  size_t sVar8;
  long lVar9;
  size_t size_00;
  void *__n_00;
  ConstPool *pCVar10;
  Node *pNVar11;
  bool bVar12;
  Compare cmp;
  Node *local_78;
  Tree *local_70;
  Tree *local_68;
  Compare local_50;
  void *local_48;
  Tree *local_40;
  void *local_38;
  
  EVar4 = 2;
  switch(size) {
  case 1:
    bVar12 = false;
    lVar6 = 0;
    goto LAB_001177e9;
  case 2:
    lVar6 = 1;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_001177aa_caseD_3;
  case 4:
    lVar6 = 2;
    break;
  case 8:
    lVar6 = 3;
    break;
  default:
    if (size != 0x20) {
      if (size != 0x10) {
        return 2;
      }
      lVar6 = 4;
      break;
    }
    lVar6 = 5;
    bVar12 = true;
    goto LAB_001177e9;
  }
  bVar12 = false;
LAB_001177e9:
  local_40 = this->_tree;
  local_68 = this->_tree + lVar6;
  __n = local_68->_dataSize;
  for (pNVar11 = (local_68->_tree)._root; pNVar11 != (Node *)0x0;
      pNVar11 = (Node *)((pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                         _rbNodeData[uVar5 >> 0x1f] & 0xfffffffffffffffe)) {
    uVar5 = memcmp(pNVar11 + 1,data,__n);
    if (uVar5 == 0) goto LAB_0011783d;
  }
  pNVar11 = (Node *)0x0;
LAB_0011783d:
  if (pNVar11 == (Node *)0x0) {
    local_78 = (Node *)0xffffffffffffffff;
    pCVar10 = this;
    local_70 = (Tree *)dstOffset;
    if (!bVar12) {
      lVar9 = lVar6 + -5;
      local_78 = (Node *)0xffffffffffffffff;
      do {
        pGVar2 = this->_gaps[lVar6];
        if (pGVar2 != (Gap *)0x0) {
          local_78 = (Node *)pGVar2->_offset;
          sVar8 = pGVar2->_size;
          this->_gaps[lVar6] = pGVar2->_next;
          pGVar2->_next = this->_gapPool;
          this->_gapPool = pGVar2;
          if ((ulong)local_78 % size != 0) {
            add();
            goto LAB_00117b6e;
          }
          sVar8 = sVar8 - size;
          if (sVar8 != 0) {
            ConstPool_addGap(this,(size_t)local_78,sVar8);
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0);
    }
    if (local_78 == (Node *)0xffffffffffffffff) {
      sVar8 = this->_size;
      size_00 = (-size & (sVar8 + size) - 1) - sVar8;
      if (size_00 != 0) {
        ConstPool_addGap(this,sVar8,size_00);
        this->_size = this->_size + size_00;
      }
      local_78 = (Node *)this->_size;
      this->_size = (long)(local_78->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                          super_ZoneTreeNode._rbNodeData + size;
    }
    pZVar3 = this->_zone;
    pNVar11 = (Node *)((ulong)(pZVar3->_ptr + 7) & 0xfffffffffffffff8);
    if (pNVar11 < (Node *)pZVar3->_end && size + 0x18 <= (ulong)((long)pZVar3->_end - (long)pNVar11)
       ) {
      pZVar3->_ptr = (uint8_t *)
                     ((long)pNVar11[1].super_ZoneTreeNodeT<asmjit::ConstPool::Node>.
                            super_ZoneTreeNode._rbNodeData + size);
    }
    else {
      pNVar11 = (Node *)Zone::_alloc(pZVar3,size + 0x18,8);
    }
    if (pNVar11 == (Node *)0x0) goto LAB_00117b73;
    (pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData[0] = 0;
    (pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData[1] = 0;
    pNVar11->field_0x10 = pNVar11->field_0x10 & 0xfe;
    pNVar11->_offset = (uint32_t)local_78;
    memcpy(pNVar11 + 1,data,size);
    while (pNVar11 != (Node *)0x0) {
      local_50._dataSize = local_68->_dataSize;
      ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>
                (&local_68->_tree,pNVar11,&local_50);
      local_68->_size = local_68->_size + 1;
      pvVar7 = (void *)pCVar10->_alignment;
      if ((void *)pCVar10->_alignment <= size) {
        pvVar7 = (void *)size;
      }
      pCVar10->_alignment = (size_t)pvVar7;
      (local_70->_tree)._root = local_78;
      if (size < (void *)0x5) goto LAB_0011784e;
      local_68 = (Tree *)0x1;
      pvVar7 = (void *)size;
      local_48 = data;
      while (bVar12 = lVar6 != 0, lVar6 = lVar6 + -1, bVar12) {
        __n_00 = (void *)((ulong)pvVar7 >> 1);
        local_68 = (Tree *)((long)local_68 * 2);
        local_38 = pvVar7;
        if (local_68 != (Tree *)0x0) {
          local_70 = local_40 + lVar6;
          data = (void *)((long)__n_00 + 0x18);
          lVar9 = 0;
          size = (size_t)local_48;
          do {
            pCVar10 = (ConstPool *)local_70->_dataSize;
            for (pNVar11 = (local_70->_tree)._root; pNVar11 != (Node *)0x0;
                pNVar11 = (Node *)((pNVar11->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                   super_ZoneTreeNode._rbNodeData[uVar5 >> 0x1f] &
                                  0xfffffffffffffffe)) {
              uVar5 = memcmp(pNVar11 + 1,(void *)size,(size_t)pCVar10);
              if (uVar5 == 0) goto LAB_00117a7d;
            }
            pNVar11 = (Node *)0x0;
LAB_00117a7d:
            if (pNVar11 == (Node *)0x0) {
              pZVar3 = this->_zone;
              pCVar10 = (ConstPool *)((ulong)(pZVar3->_ptr + 7) & 0xfffffffffffffff8);
              if (pCVar10 < (ConstPool *)pZVar3->_end &&
                  data <= (void *)((long)pZVar3->_end - (long)pCVar10)) {
                pZVar3->_ptr = (uint8_t *)((long)data + (long)(pCVar10->_tree + -1) + 0x10);
              }
              else {
                pCVar10 = (ConstPool *)Zone::_alloc(pZVar3,(size_t)data,8);
              }
              if (pCVar10 == (ConstPool *)0x0) {
                pCVar10 = (ConstPool *)0x0;
              }
              else {
                pCVar10->_zone = (Zone *)0x0;
                pCVar10->_tree[0]._tree._root = (Node *)0x0;
                psVar1 = &pCVar10->_tree[0]._size;
                *(byte *)psVar1 = (byte)*psVar1 | 1;
                *(int *)((long)&pCVar10->_tree[0]._size + 4) =
                     (int)lVar9 * (int)__n_00 + (int)local_78;
                memcpy(&pCVar10->_tree[0]._dataSize,(void *)size,(size_t)__n_00);
              }
              local_50._dataSize = local_70->_dataSize;
              ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>
                        (&local_70->_tree,(Node *)pCVar10,&local_50);
              local_70->_size = local_70->_size + 1;
            }
            lVar9 = lVar9 + 1;
            size = size + (long)__n_00;
          } while ((Tree *)lVar9 != local_68);
        }
        pvVar7 = __n_00;
        if (local_38 < (void *)0xa) goto LAB_0011784e;
      }
LAB_00117b6e:
      add();
LAB_00117b73:
      pNVar11 = (Node *)0x0;
    }
    EVar4 = 1;
  }
  else {
    *dstOffset = (ulong)pNVar11->_offset;
LAB_0011784e:
    EVar4 = 0;
  }
switchD_001177aa_caseD_3:
  return EVar4;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can
  // be used for the requested data.
  size_t offset = ~size_t(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapSize = gap->_size;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Support::isAligned<size_t>(offset, size));

      gapSize -= size;
      if (gapSize > 0)
        ConstPool_addGap(this, gapOffset, gapSize);
    }

    gapIndex++;
  }

  if (offset == ~size_t(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly
    // to the 'size'.
    size_t diff = Support::alignUpDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (!node) return DebugUtils::errored(kErrorOutOfMemory);

  _tree[treeIndex].insert(node);
  _alignment = Support::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern.
  // We stop at size 4, it probably doesn't make sense to split constants down
  // to 1 byte.
  size_t pCount = 1;
  while (size > 4) {
    size >>= 1;
    pCount <<= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += size) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, size, offset + (i * size), true);
      _tree[treeIndex].insert(node);
    }
  }

  return kErrorOk;
}